

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void __thiscall TPZAnalysis::OptimizeBandwidth(TPZAnalysis *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  TPZCompEl *pTVar3;
  TPZRenumbering *pTVar4;
  int64_t iVar5;
  TPZCompEl **ppTVar6;
  long nelem;
  TPZVec<long> perm;
  TPZVec<long> iperm;
  set<long,_std::less<long>,_std::allocator<long>_> depconlist;
  TPZStack<long,_10> elgraphindex;
  TPZStack<long,_10> elgraph;
  set<long,_std::less<long>,_std::allocator<long>_> indepconlist;
  TPZVec<long> local_388;
  int64_t local_368;
  undefined **local_360;
  void *local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_340;
  TPZManVector<long,_10> local_310;
  TPZManVector<long,_10> local_2a0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_230 [10];
  
  if (this->fCompMesh != (TPZCompMesh *)0x0) {
    local_388._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    local_388.fStore = (long *)0x0;
    local_388.fNElements = 0;
    local_388.fNAlloc = 0;
    local_360 = &PTR__TPZVec_01813f30;
    local_358 = (void *)0x0;
    uStack_350 = 0;
    local_348 = 0;
    TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_2a0);
    TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_310);
    iVar5 = TPZCompMesh::NIndependentConnects(this->fCompMesh);
    if (iVar5 != 0) {
      TPZCompMesh::ComputeElGraph
                (this->fCompMesh,(TPZStack<long,_10> *)&local_2a0,&local_310.super_TPZVec<long>);
      lVar2 = (this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      local_368 = iVar5;
      if (0 < lVar2) {
        p_Var1 = &local_340._M_impl.super__Rb_tree_header;
        nelem = 0;
        do {
          ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                              (&(this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>
                               ,nelem);
          pTVar3 = *ppTVar6;
          if (pTVar3 != (TPZCompEl *)0x0) {
            local_230[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_230[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_230[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_230[0]._M_impl.super__Rb_tree_header._M_header;
            local_230[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_340._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_340._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_340._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
            local_230[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_230[0]._M_impl.super__Rb_tree_header._M_header._M_left;
            (**(code **)(*(long *)pTVar3 + 0x1d8))(pTVar3,local_230,&local_340);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_340);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(local_230);
          }
          nelem = nelem + 1;
        } while (lVar2 != nelem);
      }
      pTVar4 = ((this->fRenumber).fRef)->fPointer;
      pTVar4->fNElements = local_310.super_TPZVec<long>.fNElements + -1;
      pTVar4->fNNodes = local_368;
      TPZRenumbering::SetElementGraph
                (pTVar4,&local_2a0.super_TPZVec<long>,&local_310.super_TPZVec<long>);
      pTVar4 = ((this->fRenumber).fRef)->fPointer;
      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[10])(pTVar4,&local_388,&local_360);
      TPZCompMesh::Permute(this->fCompMesh,&local_388);
      if (0x186a1 < local_310.super_TPZVec<long>.fNElements) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Applying Saddle Permute\n",0x18);
      }
      TPZCompMesh::SaddlePermute(this->fCompMesh);
    }
    TPZManVector<long,_10>::~TPZManVector(&local_310);
    TPZManVector<long,_10>::~TPZManVector(&local_2a0);
    local_360 = &PTR__TPZVec_01813f30;
    if (local_358 != (void *)0x0) {
      operator_delete__(local_358);
    }
    local_388._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_388.fStore != (long *)0x0) {
      operator_delete__(local_388.fStore);
    }
  }
  return;
}

Assistant:

void TPZAnalysis::OptimizeBandwidth() {
	//enquanto nao compilamos o BOOST no windows, vai o sloan antigo
#ifdef WIN32
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph;
	TPZStack<int64_t> elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	TPZSloan sloan(nel,nindep);
	sloan.SetElementGraph(elgraph,elgraphindex);
	sloan.Resequence(perm,iperm);
	fCompMesh->Permute(perm);
#else
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph,elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
    
    /// if there are no connects, there is no bandwidth to be optimized
    if(nindep == 0) return;
    
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	int64_t el,ncel = fCompMesh->NElements();
	int maxelcon = 0;
	for(el = 0; el<ncel; el++)
	{
		TPZCompEl *cel = fCompMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconlist,depconlist;
		cel->BuildConnectList(indepconlist,depconlist);
		int64_t locnindep = indepconlist.size();
		maxelcon = maxelcon < locnindep ? locnindep : maxelcon;
	}
	fRenumber->SetElementsNodes(nel,nindep);
	fRenumber->SetElementGraph(elgraph,elgraphindex);
#ifdef PZ_LOG2
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        fRenumber->Print(elgraph, elgraphindex, "Elgraph of submesh", sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    bool shouldstop = false;
    try {
        fRenumber->Resequence(perm,iperm);
    } catch(...)
    {
        fRenumber->PlotElementGroups("ElementGroups.vtk", fCompMesh);
        std::ofstream out("fElementGroups.txt");
        fCompMesh->Print(out);
        shouldstop = true;
    }
    if(shouldstop) DebugStop();
    
	fCompMesh->Permute(perm);
    if (nel > 100000) {
        std::cout << "Applying Saddle Permute\n";
    }
    fCompMesh->SaddlePermute();
//    fCompMesh->SaddlePermute2();
	
#endif
	
}